

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

int readMPS_dense_cpp(char *filename,int mxNumRow,int mxNumCol,int *numRow_p,int *numCol_p,
                     int *objSense_p,double *objOffset_p,double **A_rw_p,double **rhs_p,
                     double **cost_p,double **lb_p,double **ub_p,int **integerColumn_p)

{
  size_t sVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  double *pdVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int objSense;
  int numCol;
  int numRow;
  double objOffset;
  vector<int,_std::allocator<int>_> integerColumn;
  vector<double,_std::allocator<double>_> ub;
  vector<double,_std::allocator<double>_> lb;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> A_rw;
  
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar4 = readMPS_dense(filename,mxNumRow,mxNumCol,&numRow,&numCol,&objSense,&objOffset,&A_rw,&rhs,
                        &cost,&lb,&ub,&integerColumn);
  if (iVar4 == 0) {
    *numRow_p = numRow;
    lVar7 = (long)numCol;
    *numCol_p = numCol;
    *objSense_p = objSense;
    *objOffset_p = objOffset;
    printf("readMPS_dense_cpp: Model has %d rows and %d columns\n",(ulong)(uint)numRow,
           (ulong)(uint)numCol);
    printf("readMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n",SUB84(objOffset,0),
           (ulong)(uint)objSense);
    sVar1 = (long)numRow * 8;
    pdVar5 = (double *)malloc(sVar1 * lVar7);
    *A_rw_p = pdVar5;
    pdVar5 = (double *)malloc(sVar1);
    *rhs_p = pdVar5;
    sVar1 = lVar7 * 8;
    pdVar5 = (double *)malloc(sVar1);
    *cost_p = pdVar5;
    pdVar5 = (double *)malloc(sVar1);
    *lb_p = pdVar5;
    pdVar5 = (double *)malloc(sVar1);
    *ub_p = pdVar5;
    piVar6 = (int *)malloc(lVar7 * 4);
    *integerColumn_p = piVar6;
    if (0 < numCol * numRow) {
      pdVar5 = *A_rw_p;
      uVar9 = 0;
      do {
        pdVar5[uVar9] =
             A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uint)(numCol * numRow) != uVar9);
    }
    if (0 < numRow) {
      pdVar5 = *rhs_p;
      lVar8 = 0;
      do {
        pdVar5[lVar8] =
             rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar8];
        lVar8 = lVar8 + 1;
      } while (numRow != lVar8);
    }
    if (numCol < 1) {
      iVar4 = 0;
      goto LAB_001529bd;
    }
    pdVar5 = *cost_p;
    pdVar2 = *lb_p;
    pdVar3 = *ub_p;
    iVar4 = 0;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)pdVar5 + lVar8 * 2) =
           *(undefined8 *)
            ((long)cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8 * 2);
      *(undefined8 *)((long)pdVar2 + lVar8 * 2) =
           *(undefined8 *)
            ((long)lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8 * 2);
      *(undefined8 *)((long)pdVar3 + lVar8 * 2) =
           *(undefined8 *)
            ((long)ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8 * 2);
      *(undefined4 *)((long)piVar6 + lVar8) =
           *(undefined4 *)
            ((long)integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8);
      lVar8 = lVar8 + 4;
    } while (lVar7 * 4 - lVar8 != 0);
  }
  else {
LAB_001529bd:
    if (integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_00152b9a;
  }
  operator_delete(integerColumn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00152b9a:
  if (ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ub.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(lb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(A_rw.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int readMPS_dense_cpp(const char *filename, int mxNumRow, int mxNumCol, 
		      int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
		      double ** A_rw_p,
		      double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p,
		      int** integerColumn_p) {
  int numRow, numCol, objSense;
  double objOffset;
  vector<double> A_rw, rhs, cost, lb, ub;
  vector<int> integerColumn;
  int rtCd = readMPS_dense(filename, mxNumRow, mxNumCol,
			   numRow, numCol, objSense, objOffset,
			   A_rw,
			   rhs, cost, lb, ub,
			   integerColumn);
  if (rtCd) return rtCd;
  (*numRow_p) = numRow;
  (*numCol_p) = numCol;
  (*objSense_p) = objSense;
  (*objOffset_p) = objOffset;
#ifdef JAJH_dev
    printf("readMPS_dense_cpp: Model has %d rows and %d columns\n", numRow, numCol);
    printf("readMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  *A_rw_p = (double *) malloc(sizeof(double)*numRow*numCol);
  *rhs_p = (double *) malloc(sizeof(double)*numRow);
  *cost_p = (double *) malloc(sizeof(double)*numCol);
  *lb_p = (double *) malloc(sizeof(double)*numCol);
  *ub_p = (double *) malloc(sizeof(double)*numCol);
  *integerColumn_p = (int *) malloc(sizeof(int)*numCol);
  for (int ix_n=0; ix_n<numRow*numCol; ix_n++) {
    (*A_rw_p)[ix_n] = A_rw[ix_n];
  }
  for (int r_n=0; r_n<numRow; r_n++) {
    (*rhs_p)[r_n] = rhs[r_n];
  }
  for (int c_n=0; c_n<numCol; c_n++) {
    (*cost_p)[c_n] = cost[c_n];
    (*lb_p)[c_n] = lb[c_n];
    (*ub_p)[c_n] = ub[c_n];
    (*integerColumn_p)[c_n] = integerColumn[c_n];
  }
  return 0;
}